

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_http_to_fallback(lws *wsi,uchar *obuf,size_t olen)

{
  byte bVar1;
  uint8_t uVar2;
  lws_protocols *plVar3;
  int iVar4;
  uint uVar5;
  lws_role_ops *plVar6;
  lws_protocols *plVar7;
  byte bVar8;
  uint8_t uVar9;
  lws_vhost *vh;
  char *pcVar10;
  lws_protocols *p;
  lws_role_ops *ops;
  char ipbuf [64];
  
  vh = (wsi->a).vhost;
  bVar1 = vh->raw_protocol_index;
  plVar3 = vh->protocols;
  ops = &role_ops_raw_skt;
  if (vh->listen_accept_role != (char *)0x0) {
    plVar6 = lws_role_by_name(vh->listen_accept_role);
    vh = (wsi->a).vhost;
    if (plVar6 != (lws_role_ops *)0x0) {
      ops = lws_role_by_name(vh->listen_accept_role);
      vh = (wsi->a).vhost;
    }
  }
  p = plVar3 + bVar1;
  if (vh->listen_accept_protocol != (char *)0x0) {
    plVar7 = lws_vhost_name_to_protocol(vh,vh->listen_accept_protocol);
    if (plVar7 != (lws_protocols *)0x0) {
      p = plVar7;
    }
  }
  lws_bind_protocol(wsi,p,"lws_http_to_fallback");
  lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,ops);
  lws_header_table_detach(wsi,0);
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  bVar1 = wsi->role_ops->adoption_cb[1];
  bVar8 = 0x13;
  if (bVar1 != 0) {
    bVar8 = bVar1;
  }
  ipbuf[0] = '\0';
  lws_get_peer_simple(wsi,ipbuf,0x40);
  if (ops == (lws_role_ops *)0x0) {
    pcVar10 = "null";
  }
  else {
    pcVar10 = ops->name;
  }
  _lws_log(4,"%s: vh %s, peer: %s, role %s, protocol %s, cb %d, ah %p\n","lws_http_to_fallback",
           ((wsi->a).vhost)->name,ipbuf,pcVar10,p->name,(ulong)bVar8,(wsi->http).ah);
  iVar4 = (*((wsi->a).protocol)->callback)
                    (wsi,(lws_callback_reasons)bVar8,wsi->user_space,(void *)0x0,0);
  uVar5 = 1;
  if (iVar4 == 0) {
    uVar2 = wsi->role_ops->rx_cb[(wsi->wsistate >> 0x1d & 1) != 0];
    uVar9 = ';';
    if (uVar2 != '\0') {
      uVar9 = uVar2;
    }
    iVar4 = (*((wsi->a).protocol)->callback)
                      (wsi,(lws_callback_reasons)uVar9,wsi->user_space,obuf,olen);
    uVar5 = (uint)(iVar4 != 0);
  }
  return uVar5;
}

Assistant:

int
lws_http_to_fallback(struct lws *wsi, unsigned char *obuf, size_t olen)
{
	const struct lws_role_ops *role = &role_ops_raw_skt;
	const struct lws_protocols *p1, *protocol =
			 &wsi->a.vhost->protocols[wsi->a.vhost->raw_protocol_index];
	char ipbuf[64];
	int n;

	if (wsi->a.vhost->listen_accept_role &&
	    lws_role_by_name(wsi->a.vhost->listen_accept_role))
		role = lws_role_by_name(wsi->a.vhost->listen_accept_role);

	if (wsi->a.vhost->listen_accept_protocol) {
		p1 = lws_vhost_name_to_protocol(wsi->a.vhost,
			    wsi->a.vhost->listen_accept_protocol);
		if (p1)
			protocol = p1;
	}

	lws_bind_protocol(wsi, protocol, __func__);

	lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED, role);

	lws_header_table_detach(wsi, 0);
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (wsi->role_ops->adoption_cb[1])
		n = wsi->role_ops->adoption_cb[1];

	ipbuf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
	lws_get_peer_simple(wsi, ipbuf, sizeof(ipbuf));
#endif

	lwsl_notice("%s: vh %s, peer: %s, role %s, "
		    "protocol %s, cb %d, ah %p\n", __func__, wsi->a.vhost->name,
		    ipbuf, role ? role->name : "null", protocol->name, n,
		    wsi->http.ah);

	if ((wsi->a.protocol->callback)(wsi, (enum lws_callback_reasons)n, wsi->user_space, NULL, 0))
		return 1;

	n = LWS_CALLBACK_RAW_RX;
	if (wsi->role_ops->rx_cb[lwsi_role_server(wsi)])
		n = wsi->role_ops->rx_cb[lwsi_role_server(wsi)];
	if (wsi->a.protocol->callback(wsi, (enum lws_callback_reasons)n, wsi->user_space, obuf, olen))
		return 1;

	return 0;
}